

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::logic_t>::emplaceRealloc<slang::logic_t>
          (SmallVectorBase<slang::logic_t> *this,pointer pos,logic_t *args)

{
  ulong uVar1;
  pointer p;
  size_type sVar2;
  pointer plVar3;
  pointer plVar4;
  pointer plVar5;
  size_type sVar6;
  ulong n;
  long lVar7;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  n = this->len + 1;
  uVar1 = this->cap;
  if (n < uVar1 * 2) {
    n = uVar1 * 2;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    n = 0x7fffffffffffffff;
  }
  lVar7 = (long)pos - (long)this->data_;
  plVar5 = (pointer)operator_new(n);
  plVar5[lVar7].value = args->value;
  p = this->data_;
  sVar2 = this->len;
  plVar3 = p;
  plVar4 = plVar5;
  if (p + (sVar2 - (long)pos) == (pointer)0x0) {
    if (sVar2 != 0) {
      sVar6 = 0;
      do {
        plVar5[sVar6].value = p[sVar6].value;
        sVar6 = sVar6 + 1;
      } while (sVar2 != sVar6);
    }
  }
  else {
    for (; plVar3 != pos; plVar3 = plVar3 + 1) {
      plVar4->value = plVar3->value;
      plVar4 = plVar4 + 1;
    }
    memcpy(plVar5 + lVar7 + 1,pos,(size_t)(p + (sVar2 - (long)pos)));
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = n;
  this->data_ = plVar5;
  return plVar5 + lVar7;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}